

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerGLSL::track_expression_read(CompilerGLSL *this,uint32_t id)

{
  Variant *this_00;
  size_t sVar1;
  TypedID<(spirv_cross::Types)0> *pTVar2;
  bool bVar3;
  SPIRExpression *pSVar4;
  SPIRAccessChain *pSVar5;
  size_type sVar6;
  mapped_type *pmVar7;
  long lVar8;
  uint32_t local_2c;
  uint32_t local_28;
  uint32_t local_24;
  
  this_00 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr + id;
  local_2c = id;
  if (this_00->type == TypeAccessChain) {
    pSVar5 = Variant::get<spirv_cross::SPIRAccessChain>(this_00);
    sVar1 = (pSVar5->implied_read_expressions).
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
    if (sVar1 != 0) {
      pTVar2 = (pSVar5->implied_read_expressions).
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
      lVar8 = 0;
      do {
        track_expression_read(this,*(uint32_t *)((long)&pTVar2->id + lVar8));
        lVar8 = lVar8 + 4;
      } while (sVar1 << 2 != lVar8);
    }
  }
  else if (this_00->type == TypeExpression) {
    pSVar4 = Variant::get<spirv_cross::SPIRExpression>(this_00);
    sVar1 = (pSVar4->implied_read_expressions).
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
    if (sVar1 != 0) {
      pTVar2 = (pSVar4->implied_read_expressions).
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
      lVar8 = 0;
      do {
        track_expression_read(this,*(uint32_t *)((long)&pTVar2->id + lVar8));
        lVar8 = lVar8 + 4;
      } while (sVar1 << 2 != lVar8);
    }
  }
  local_28 = local_2c;
  sVar6 = ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&(this->super_Compiler).forwarded_temporaries._M_h,&local_28);
  if (sVar6 != 0) {
    local_24 = local_2c;
    sVar6 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&(this->super_Compiler).suppressed_usage_tracking._M_h,&local_24);
    if (sVar6 == 0) {
      pmVar7 = ::std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->expression_usage_counts,&local_2c);
      *pmVar7 = *pmVar7 + 1;
      bVar3 = expression_read_implies_multiple_reads(this,local_2c);
      if (bVar3) {
        *pmVar7 = *pmVar7 + 1;
      }
      if (1 < *pmVar7) {
        force_temporary_and_recompile(this,local_2c);
      }
    }
  }
  return;
}

Assistant:

void CompilerGLSL::track_expression_read(uint32_t id)
{
	switch (ir.ids[id].get_type())
	{
	case TypeExpression:
	{
		auto &e = get<SPIRExpression>(id);
		for (auto implied_read : e.implied_read_expressions)
			track_expression_read(implied_read);
		break;
	}

	case TypeAccessChain:
	{
		auto &e = get<SPIRAccessChain>(id);
		for (auto implied_read : e.implied_read_expressions)
			track_expression_read(implied_read);
		break;
	}

	default:
		break;
	}

	// If we try to read a forwarded temporary more than once we will stamp out possibly complex code twice.
	// In this case, it's better to just bind the complex expression to the temporary and read that temporary twice.
	if (expression_is_forwarded(id) && !expression_suppresses_usage_tracking(id))
	{
		auto &v = expression_usage_counts[id];
		v++;

		// If we create an expression outside a loop,
		// but access it inside a loop, we're implicitly reading it multiple times.
		// If the expression in question is expensive, we should hoist it out to avoid relying on loop-invariant code motion
		// working inside the backend compiler.
		if (expression_read_implies_multiple_reads(id))
			v++;

		if (v >= 2)
		{
			//if (v == 2)
			//    fprintf(stderr, "ID %u was forced to temporary due to more than 1 expression use!\n", id);

			// Force a recompile after this pass to avoid forwarding this variable.
			force_temporary_and_recompile(id);
		}
	}
}